

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4.h
# Opt level: O2

void ncnn::conv1x1s1_sgemm_transform_kernel_pack4_sse
               (Mat *kernel,Mat *kernel_pack4,int inch,int outch)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Mat local_78;
  
  Mat::create(kernel_pack4,1,inch / 4,outch / 4,0x40,0x10,(Allocator *)0x0);
  lVar9 = (long)inch;
  lVar7 = lVar9 * 4 + 0xc;
  lVar4 = lVar9 * 8 + 0xc;
  lVar10 = lVar9 * 0x10;
  lVar8 = lVar9 * 0xc + 0xc;
  lVar9 = 0xc;
  for (uVar3 = 0; (long)(uVar3 | 3) < (long)outch; uVar3 = uVar3 + 4) {
    pvVar1 = kernel->data;
    Mat::channel(&local_78,kernel_pack4,(int)(uVar3 >> 2));
    pvVar2 = local_78.data;
    Mat::~Mat(&local_78);
    lVar6 = 0;
    for (iVar5 = 3; iVar5 < inch; iVar5 = iVar5 + 4) {
      *(undefined4 *)((long)pvVar2 + lVar6 * 4) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar9 + -0xc);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 4) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar7 + -0xc);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 8) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar4 + -0xc);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0xc) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar8 + -0xc);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x10) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar9 + -8);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x14) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar7 + -8);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x18) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar4 + -8);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x1c) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar8 + -8);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x20) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar9 + -4);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x24) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar7 + -4);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x28) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar4 + -4);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x2c) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar8 + -4);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x30) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar9);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x34) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar7);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x38) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar4);
      *(undefined4 *)((long)pvVar2 + lVar6 * 4 + 0x3c) =
           *(undefined4 *)((long)pvVar1 + lVar6 + lVar8);
      lVar6 = lVar6 + 0x10;
    }
    lVar9 = lVar9 + lVar10;
    lVar7 = lVar7 + lVar10;
    lVar4 = lVar4 + lVar10;
    lVar8 = lVar8 + lVar10;
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_pack4_sse(const Mat& kernel, Mat& kernel_pack4, int inch, int outch)
{
    // interleave
    // src = inch-outch
    // dst = 4b-4a-inch/4a-outch/4b
    kernel_pack4.create(1, inch / 4, outch / 4, (size_t)4u * 16, 16);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const float* k0 = (const float*)kernel + (q + 0) * inch;
        const float* k1 = (const float*)kernel + (q + 1) * inch;
        const float* k2 = (const float*)kernel + (q + 2) * inch;
        const float* k3 = (const float*)kernel + (q + 3) * inch;

        float* g0 = kernel_pack4.channel(q / 4);

        for (int p = 0; p + 3 < inch; p += 4)
        {
            g0[0] = k0[0];
            g0[1] = k1[0];
            g0[2] = k2[0];
            g0[3] = k3[0];

            g0[4] = k0[1];
            g0[5] = k1[1];
            g0[6] = k2[1];
            g0[7] = k3[1];

            g0[8] = k0[2];
            g0[9] = k1[2];
            g0[10] = k2[2];
            g0[11] = k3[2];

            g0[12] = k0[3];
            g0[13] = k1[3];
            g0[14] = k2[3];
            g0[15] = k3[3];

            k0 += 4;
            k1 += 4;
            k2 += 4;
            k3 += 4;
            g0 += 16;
        }
    }
}